

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

string * __thiscall
lest::make_tuple_string<std::tuple<char,int,double,char_const*>,2ul>::make_abi_cxx11_
          (string *__return_storage_ptr__,
          make_tuple_string<std::tuple<char,int,double,char_const*>,2ul> *this,
          tuple<char,_int,_double,_const_char_*> *tuple)

{
  ulong *puVar1;
  size_type sVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  int *value;
  tuple<char,_int,_double,_const_char_*> *extraout_RDX;
  tuple<char,_int,_double,_const_char_*> *extraout_RDX_00;
  tuple<char,_int,_double,_const_char_*> *tuple_00;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  ostringstream os;
  ulong *local_218;
  ulong local_208;
  undefined8 uStack_200;
  ulong *local_1f8;
  size_type local_1f0;
  ulong local_1e8;
  undefined8 uStack_1e0;
  string local_1d8;
  string local_1b8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  string_maker<int>::to_string_abi_cxx11_(&local_1b8,(string_maker<int> *)(this + 0x10),value);
  _Var5._M_p = local_1b8._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) {
    uStack_200 = local_1b8.field_2._8_8_;
    _Var5._M_p = (pointer)&local_208;
  }
  local_208 = local_1b8.field_2._M_allocated_capacity;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_198,_Var5._M_p,local_1b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
  tuple_00 = extraout_RDX;
  if ((ulong *)_Var5._M_p != &local_208) {
    operator_delete(_Var5._M_p,local_208 + 1);
    tuple_00 = extraout_RDX_00;
  }
  make_tuple_string<std::tuple<char,int,double,char_const*>,1ul>::make_abi_cxx11_
            (&local_1d8,(make_tuple_string<std::tuple<char,int,double,char_const*>,1ul> *)this,
             tuple_00);
  std::__cxx11::stringbuf::str();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p == &local_1b8.field_2) {
    uStack_1e0 = local_1b8.field_2._8_8_;
    local_1b8._M_dataplus._M_p = (pointer)&local_1e8;
  }
  local_1e8 = local_1b8.field_2._M_allocated_capacity;
  local_1f0 = local_1b8._M_string_length;
  uVar6 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    uVar6 = local_1d8.field_2._M_allocated_capacity;
  }
  local_1f8 = (ulong *)local_1b8._M_dataplus._M_p;
  if ((ulong)uVar6 < local_1d8._M_string_length + local_1b8._M_string_length) {
    uVar6 = 0xf;
    if ((ulong *)local_1b8._M_dataplus._M_p != &local_1e8) {
      uVar6 = local_1b8.field_2._M_allocated_capacity;
    }
    if (local_1d8._M_string_length + local_1b8._M_string_length <= (ulong)uVar6) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_1f8,0,(char *)0x0,(ulong)local_1d8._M_dataplus._M_p);
      goto LAB_001fe9cb;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_1b8._M_dataplus._M_p);
LAB_001fe9cb:
  local_218 = &local_208;
  puVar1 = puVar4 + 2;
  if ((ulong *)*puVar4 == puVar1) {
    local_208 = *puVar1;
    uStack_200 = puVar4[3];
  }
  else {
    local_208 = *puVar1;
    local_218 = (ulong *)*puVar4;
  }
  sVar2 = puVar4[1];
  *puVar4 = puVar1;
  puVar4[1] = 0;
  *(undefined1 *)puVar1 = 0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_218 == &local_208) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_208;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_200;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_218;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_208;
  }
  __return_storage_ptr__->_M_string_length = sVar2;
  local_208 = local_208 & 0xffffffffffffff00;
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,local_1e8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_198);
  std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

static std::string make( TU const & tuple )
    {
        std::ostringstream os;
        os << to_string( std::get<N - 1>( tuple ) ) << ( N < std::tuple_size<TU>::value ? ", ": " ");
        return make_tuple_string<TU, N - 1>::make( tuple ) + os.str();
    }